

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereBoxCollisionAlgorithm.cpp
# Opt level: O1

bool __thiscall
cbtSphereBoxCollisionAlgorithm::getSphereDistance
          (cbtSphereBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *boxObjWrap,
          cbtVector3 *pointOnBox,cbtVector3 *normal,cbtScalar *penetrationDepth,
          cbtVector3 *sphereCenter,cbtScalar fRadius,cbtScalar maxContactDistance)

{
  uint uVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined8 uVar4;
  cbtSphereBoxCollisionAlgorithm *pcVar5;
  cbtTransform *pcVar6;
  float fVar7;
  undefined1 auVar8 [16];
  cbtScalar cVar9;
  cbtSphereBoxCollisionAlgorithm *this_00;
  undefined1 auVar10 [16];
  cbtScalar cVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  float fVar21;
  cbtVector3 sphereRelPos;
  cbtVector3 local_58;
  cbtVector3 local_40;
  undefined1 extraout_var [60];
  
  pcVar5 = (cbtSphereBoxCollisionAlgorithm *)boxObjWrap->m_shape;
  this_00 = pcVar5;
  cVar11 = fRadius;
  (*(pcVar5->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
    _vptr_cbtCollisionAlgorithm[0xc])();
  *penetrationDepth = 1.0;
  pcVar6 = boxObjWrap->m_worldTransform;
  fVar7 = sphereCenter->m_floats[0] - (pcVar6->m_origin).m_floats[0];
  fVar21 = sphereCenter->m_floats[1] - (pcVar6->m_origin).m_floats[1];
  fVar12 = sphereCenter->m_floats[2] - (pcVar6->m_origin).m_floats[2];
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * (pcVar6->m_basis).m_el[1].m_floats[0])),
                            ZEXT416((uint)fVar7),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar12),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * (pcVar6->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)fVar7),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[1]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar12),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[1]));
  auVar10 = vinsertps_avx(auVar10,auVar13,0x10);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * (pcVar6->m_basis).m_el[1].m_floats[2])),
                            ZEXT416((uint)fVar7),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar12),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
  local_40.m_floats = (cbtScalar  [4])vinsertps_avx(auVar10,auVar13,0x28);
  uVar1 = *(uint *)((long)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.
                           super_cbtCollisionAlgorithm._vptr_cbtCollisionAlgorithm + 4);
  local_58.m_floats[0] = local_40.m_floats[0];
  cVar2 = local_58.m_floats[0];
  auVar10 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)local_58.m_floats[0]));
  auVar13._0_4_ = uVar1 ^ 0x80000000;
  auVar13._4_4_ = 0x80000000;
  auVar13._8_4_ = 0x80000000;
  auVar13._12_4_ = 0x80000000;
  auVar10 = vmaxss_avx(auVar13,auVar10);
  local_58.m_floats[1] = local_40.m_floats[1];
  cVar3 = local_58.m_floats[1];
  uVar1 = *(uint *)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.super_cbtCollisionAlgorithm.
                    m_dispatcher;
  auVar13 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)local_58.m_floats[1]));
  auVar17._0_4_ = uVar1 ^ 0x80000000;
  auVar17._4_4_ = 0x80000000;
  auVar17._8_4_ = 0x80000000;
  auVar17._12_4_ = 0x80000000;
  auVar13 = vmaxss_avx(auVar17,auVar13);
  local_58.m_floats[1] = auVar13._0_4_;
  local_58.m_floats[0] = auVar10._0_4_;
  uVar1 = *(uint *)((long)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.
                           super_cbtCollisionAlgorithm.m_dispatcher + 4);
  local_58.m_floats[2] = local_40.m_floats[2];
  cVar9 = local_58.m_floats[2];
  auVar17 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)local_58.m_floats[2]));
  auVar19._0_4_ = uVar1 ^ 0x80000000;
  auVar19._4_4_ = 0x80000000;
  auVar19._8_4_ = 0x80000000;
  auVar19._12_4_ = 0x80000000;
  auVar17 = vmaxss_avx(auVar19,auVar17);
  local_58.m_floats[3] = local_40.m_floats[3];
  local_58.m_floats[2] = auVar17._0_4_;
  fVar7 = cVar11 + fRadius + maxContactDistance;
  auVar10 = vinsertps_avx(ZEXT416((uint)(cVar2 - auVar10._0_4_)),
                          ZEXT416((uint)(cVar3 - auVar13._0_4_)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(cVar9 - auVar17._0_4_)),0x28);
  *(undefined1 (*) [16])normal->m_floats = auVar10;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(normal->m_floats[1] * normal->m_floats[1])),
                            ZEXT416((uint)normal->m_floats[0]),ZEXT416((uint)normal->m_floats[0]));
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)normal->m_floats[2]),ZEXT416((uint)normal->m_floats[2]),
                            auVar10);
  fVar21 = auVar10._0_4_;
  fVar7 = fVar7 * fVar7;
  if (fVar21 <= fVar7) {
    if (fVar21 <= 1.1920929e-07) {
      auVar15._0_4_ =
           getSpherePenetration
                     (this_00,(cbtVector3 *)
                              ((long)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.
                                      super_cbtCollisionAlgorithm._vptr_cbtCollisionAlgorithm + 4),
                      &local_40,&local_58,normal);
      auVar15._4_60_ = extraout_var;
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar10 = vxorps_avx512vl(auVar15._0_16_,auVar10);
      fVar12 = auVar10._0_4_;
    }
    else {
      if (fVar21 < 0.0) {
        fVar12 = sqrtf(fVar21);
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar12 = auVar10._0_4_;
      }
      fVar16 = 1.0 / fVar12;
      normal->m_floats[0] = fVar16 * normal->m_floats[0];
      normal->m_floats[1] = fVar16 * normal->m_floats[1];
      normal->m_floats[2] = fVar16 * normal->m_floats[2];
    }
    auVar10 = vinsertps_avx(ZEXT416((uint)(cVar11 * normal->m_floats[0] + local_58.m_floats[0])),
                            ZEXT416((uint)(cVar11 * normal->m_floats[1] + local_58.m_floats[1])),
                            0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(cVar11 * normal->m_floats[2] +
                                                  local_58.m_floats[2])),0x28);
    *(undefined1 (*) [16])pointOnBox->m_floats = auVar10;
    *penetrationDepth = fVar12 - (cVar11 + fRadius);
    cVar2 = pointOnBox->m_floats[0];
    fVar12 = pointOnBox->m_floats[1];
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar6->m_basis).m_el[0].m_floats[1])),
                              ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
    cVar3 = pointOnBox->m_floats[2];
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)cVar3),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar6->m_basis).m_el[1].m_floats[1])),
                              ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar3),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar6->m_basis).m_el[2].m_floats[1])),
                              ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar3),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
    auVar10 = vinsertps_avx(ZEXT416((uint)(auVar10._0_4_ + (pcVar6->m_origin).m_floats[0])),
                            ZEXT416((uint)(auVar13._0_4_ + (pcVar6->m_origin).m_floats[1])),0x10);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
    auVar20 = SUB1612(auVar8 << 0x40,4);
    auVar18._4_12_ = auVar20;
    auVar18._0_4_ = auVar17._0_4_ + (pcVar6->m_origin).m_floats[2];
    uVar4 = vmovlps_avx(auVar10);
    *(undefined8 *)pointOnBox->m_floats = uVar4;
    uVar4 = vmovlps_avx(auVar18);
    *(undefined8 *)(pointOnBox->m_floats + 2) = uVar4;
    cVar2 = normal->m_floats[0];
    fVar12 = normal->m_floats[1];
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar6->m_basis).m_el[0].m_floats[1])),
                              ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
    cVar3 = normal->m_floats[2];
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)cVar3),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar6->m_basis).m_el[1].m_floats[1])),
                              ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar3),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
    auVar10 = vinsertps_avx(auVar10,auVar13,0x10);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar6->m_basis).m_el[2].m_floats[1])),
                              ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar3),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
    auVar14._4_12_ = auVar20;
    auVar14._0_4_ = auVar13._0_4_;
    uVar4 = vmovlps_avx(auVar10);
    *(undefined8 *)normal->m_floats = uVar4;
    uVar4 = vmovlps_avx(auVar14);
    *(undefined8 *)(normal->m_floats + 2) = uVar4;
  }
  return fVar21 <= fVar7;
}

Assistant:

bool cbtSphereBoxCollisionAlgorithm::getSphereDistance(const cbtCollisionObjectWrapper* boxObjWrap, cbtVector3& pointOnBox, cbtVector3& normal, cbtScalar& penetrationDepth, const cbtVector3& sphereCenter, cbtScalar fRadius, cbtScalar maxContactDistance)
{
	const cbtBoxShape* boxShape = (const cbtBoxShape*)boxObjWrap->getCollisionShape();
	cbtVector3 const& boxHalfExtent = boxShape->getHalfExtentsWithoutMargin();
	cbtScalar boxMargin = boxShape->getMargin();
	penetrationDepth = 1.0f;

	// convert the sphere position to the box's local space
	cbtTransform const& m44T = boxObjWrap->getWorldTransform();
	cbtVector3 sphereRelPos = m44T.invXform(sphereCenter);

	// Determine the closest point to the sphere center in the box
	cbtVector3 closestPoint = sphereRelPos;
	closestPoint.setX(cbtMin(boxHalfExtent.getX(), closestPoint.getX()));
	closestPoint.setX(cbtMax(-boxHalfExtent.getX(), closestPoint.getX()));
	closestPoint.setY(cbtMin(boxHalfExtent.getY(), closestPoint.getY()));
	closestPoint.setY(cbtMax(-boxHalfExtent.getY(), closestPoint.getY()));
	closestPoint.setZ(cbtMin(boxHalfExtent.getZ(), closestPoint.getZ()));
	closestPoint.setZ(cbtMax(-boxHalfExtent.getZ(), closestPoint.getZ()));

	cbtScalar intersectionDist = fRadius + boxMargin;
	cbtScalar contactDist = intersectionDist + maxContactDistance;
	normal = sphereRelPos - closestPoint;

	//if there is no penetration, we are done
	cbtScalar dist2 = normal.length2();
	if (dist2 > contactDist * contactDist)
	{
		return false;
	}

	cbtScalar distance;

	//special case if the sphere center is inside the box
	if (dist2 <= SIMD_EPSILON)
	{
		distance = -getSpherePenetration(boxHalfExtent, sphereRelPos, closestPoint, normal);
	}
	else  //compute the penetration details
	{
		distance = normal.length();
		normal /= distance;
	}

	pointOnBox = closestPoint + normal * boxMargin;
	//	v3PointOnSphere = sphereRelPos - (normal * fRadius);
	penetrationDepth = distance - intersectionDist;

	// transform back in world space
	cbtVector3 tmp = m44T(pointOnBox);
	pointOnBox = tmp;
	//	tmp = m44T(v3PointOnSphere);
	//	v3PointOnSphere = tmp;
	tmp = m44T.getBasis() * normal;
	normal = tmp;

	return true;
}